

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

void log_topn_densities(float64 *den,uint32 *den_idx,uint32 n_top,uint32 n_density,uint32 veclen,
                       vector_t obs,vector_t *mean,vector_t *var,float32 *log_norm,
                       uint32 *prev_den_idx)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  uint *puVar4;
  double dVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  float64 fVar13;
  double dVar14;
  
  uVar12 = (ulong)n_top;
  if (prev_den_idx == (uint32 *)0x0) {
    for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      den[uVar11] = -1.8e+307;
      den_idx[uVar11] = n_density + 1;
    }
  }
  else {
    for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
      uVar9 = prev_den_idx[uVar11];
      fVar13 = log_diag_eval(obs,log_norm[uVar9],mean[uVar9],var[uVar9],veclen);
      den_idx[uVar11] = uVar9;
      den[uVar11] = fVar13;
      uVar6 = uVar11;
      if (uVar11 != 0) {
        for (; uVar6 != 0; uVar6 = uVar6 - 1) {
          uVar7 = (int)uVar6 - 1;
          dVar14 = (double)den[uVar7];
          if ((double)fVar13 <= dVar14) break;
          den_idx[uVar6] = den_idx[uVar7];
          den[uVar6] = (float64)dVar14;
        }
        den_idx[uVar6 & 0xffffffff] = uVar9;
        den[uVar6 & 0xffffffff] = fVar13;
      }
    }
  }
  uVar6 = (ulong)(n_top - 1);
  fVar13 = den[uVar6];
  uVar11 = 0;
LAB_00122c25:
  if (uVar11 == n_density) {
    return;
  }
  uVar10 = 0;
  for (dVar14 = (double)(float)log_norm[uVar11]; (uVar10 < veclen && ((double)fVar13 < dVar14));
      dVar14 = dVar14 - (double)(*pfVar1 - *pfVar2) * (double)(*pfVar1 - *pfVar2) * (double)*pfVar3)
  {
    pfVar1 = obs + uVar10;
    pfVar2 = mean[uVar11] + uVar10;
    pfVar3 = var[uVar11] + uVar10;
    uVar10 = uVar10 + 1;
  }
  if ((veclen <= uVar10) && ((double)fVar13 < dVar14)) {
    uVar10 = 0;
    do {
      uVar8 = uVar6;
      if (uVar12 == uVar10) goto LAB_00122c95;
      puVar4 = den_idx + uVar10;
      uVar10 = uVar10 + 1;
    } while (uVar11 != *puVar4);
  }
  goto LAB_00122cce;
LAB_00122c95:
  if (uVar8 == 0) goto LAB_00122cbc;
  uVar9 = (int)uVar8 - 1;
  dVar5 = (double)den[uVar9];
  if (dVar14 <= dVar5) goto LAB_00122cbc;
  den_idx[uVar8] = den_idx[uVar9];
  den[uVar8] = (float64)dVar5;
  uVar8 = uVar8 - 1;
  goto LAB_00122c95;
LAB_00122cbc:
  den_idx[uVar8 & 0xffffffff] = (uint32)uVar11;
  den[uVar8 & 0xffffffff] = (float64)dVar14;
  fVar13 = den[uVar6];
LAB_00122cce:
  uVar11 = uVar11 + 1;
  goto LAB_00122c25;
}

Assistant:

static void
log_topn_densities(float64 *den,
		   uint32 *den_idx,
		   uint32 n_top,
		   uint32 n_density,
		   uint32 veclen,
		   vector_t obs,
		   vector_t *mean,
		   vector_t *var,
		   float32 *log_norm,
		   uint32 *prev_den_idx)
{
    uint32 i, j, k;
    vector_t m;
    vector_t v;
    float64 diff;
    float64 d;
    float64 worst;	/* worst density value of the top N density values
			   seen so far */

    /* Initialize topn using the previous frame's top codeword indices */
    if (prev_den_idx) {
	for (j = 0; j < n_top; j++) {
	    i = prev_den_idx[j];
	    d = log_diag_eval(obs, log_norm[i],
			      mean[i], var[i], veclen);
	    den_idx[j] = i;
	    den[j] = d;
	    if (j == 0)
		continue;
	    /* Insertion sort them */
	    for (k = j; k > 0 && d > den[k-1]; --k) {
		den_idx[k] = den_idx[k-1];
		den[k] = den[k-1];
	    }
	    den_idx[k] = i;
	    den[k] = d;
	}
    }
    else {
	for (j = 0; j < n_top; j++) {
	    den[j] = MIN_IEEE_NORM_NEG_FLOAT64;
	    den_idx[j] = n_density + 1; /* A non-negative invalid value */
	}
    }

    worst = den[n_top-1];

    for (i = 0; i < n_density; i++) {
	m = mean[i];
	v = var[i];

	/* Initialize distance with the log of the normalization
	   factor for this pdf. */

	d = log_norm[i];

	for (j = 0; (j < veclen) && (d > worst); j++) {
	    diff = obs[j] - m[j];
	    d -= diff * diff * v[j];
	}
	/* Not in topn, so keep going */
	if (j < veclen || d <= worst)
	    continue;

	/* This may already have been in topn from the initialization pass */
	for (j = 0; j < n_top; j++)
	    if (den_idx[j] == i)
		break;
	if (j < n_top)
	    continue; /* It's already there, don't insert it */
	for (k = n_top-1; k > 0 && d > den[k-1]; --k) {
	    den_idx[k] = den_idx[k-1];
	    den[k] = den[k-1];
	}
	den_idx[k] = i;
	den[k] = d;

	worst = den[n_top-1];
    }
    worst = den[n_top-1];
}